

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::enumeratePhysicalDevices
          (TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *this;
  TestLog *log;
  undefined1 auVar1 [16];
  bool bVar2;
  qpTestResult qVar3;
  InstanceInterface *vk;
  VkInstance instance;
  MessageBuilder *this_00;
  pointer ppVVar4;
  string *unit;
  void *__buf;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong __n;
  allocator<char> local_28b;
  allocator<char> local_28a;
  allocator<char> local_289;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> outputData;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> devices;
  string local_240;
  string local_220;
  ResultCollector results;
  MessageBuilder local_1b0;
  
  log = context->m_testCtx->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"",(allocator<char> *)&outputData);
  tcu::ResultCollector::ResultCollector(&results,log,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  vk = Context::getInstanceInterface(context);
  instance = Context::getInstance(context);
  ::vk::enumeratePhysicalDevices(&devices,vk,instance);
  std::__cxx11::string::string<std::allocator<char>>((string *)&outputData,"NumDevices",&local_289);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"Number of devices",&local_28a);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"",&local_28b);
  unit = &local_220;
  tcu::LogNumber<long>::LogNumber
            ((LogNumber<long> *)&local_1b0,(string *)&outputData,&local_240,unit,QP_KEY_TAG_NONE,
             (long)devices.
                   super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)devices.
                   super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  tcu::LogNumber<long>::write((LogNumber<long> *)&local_1b0,(int)log,__buf,(size_t)unit);
  tcu::LogNumber<long>::~LogNumber((LogNumber<long> *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&outputData);
  this = &local_1b0.m_str;
  lVar6 = 0;
  uVar7 = 0;
  while( true ) {
    __n = (long)devices.
                super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)devices.
                super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
    if (__n <= uVar7) break;
    local_1b0.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::ostream::_M_insert<unsigned_long>((ulong)this);
    std::operator<<((ostream *)this,": ");
    this_00 = tcu::MessageBuilder::operator<<
                        (&local_1b0,
                         (VkPhysicalDevice_s **)
                         ((long)devices.
                                super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar6));
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
    uVar7 = uVar7 + 1;
    lVar6 = lVar6 + 8;
  }
  local_240._M_dataplus._M_p = (pointer)&PTR__CheckIncompleteResult_00bca9d0;
  if (devices.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      devices.
      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
      _M_impl.super__Vector_impl_data._M_start) goto LAB_0047e56b;
  std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::vector
            (&outputData,__n,(allocator_type *)&local_1b0);
  for (ppVVar4 = outputData.
                 super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppVVar4 < outputData.
                super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVVar4 = ppVVar4 + 1) {
    *ppVVar4 = (VkPhysicalDevice_s *)0xdededededededede;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = __n;
  iVar5 = SUB164(auVar1 / ZEXT816(3),0);
  local_240._M_string_length._4_4_ = 0;
  local_240._M_string_length._0_4_ = iVar5;
  CheckEnumeratePhysicalDevicesIncompleteResult::getResult
            ((CheckEnumeratePhysicalDevicesIncompleteResult *)&local_240,context,
             outputData.
             super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (((int)local_240._M_string_length == iVar5) && (local_240._M_string_length._4_4_ == 5)) {
    bVar2 = ::vk::ValidateQueryBits::
            checkBits<__gnu_cxx::__normal_iterator<vk::VkPhysicalDevice_s**,std::vector<vk::VkPhysicalDevice_s*,std::allocator<vk::VkPhysicalDevice_s*>>>>
                      ((__normal_iterator<vk::VkPhysicalDevice_s_**,_std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>_>
                        )(outputData.
                          super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                         (SUB168(auVar1 / ZEXT816(3),0) & 0xffffffff)),
                       (__normal_iterator<vk::VkPhysicalDevice_s_**,_std::vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>_>
                        )outputData.
                         super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,0xde);
    if (!bVar2) goto LAB_0047e526;
  }
  else {
LAB_0047e526:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"Query didn\'t return VK_INCOMPLETE",
               (allocator<char> *)&local_220);
    tcu::ResultCollector::fail(&results,(string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  std::_Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
  ~_Vector_base(&outputData.
                 super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
               );
LAB_0047e56b:
  qVar3 = tcu::ResultCollector::getResult(&results);
  std::__cxx11::string::string((string *)&local_1b0,(string *)&results.m_message);
  __return_storage_ptr__->m_code = qVar3;
  std::__cxx11::string::string
            ((string *)&__return_storage_ptr__->m_description,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::_Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
  ~_Vector_base(&devices.
                 super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
               );
  tcu::ResultCollector::~ResultCollector(&results);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus enumeratePhysicalDevices (Context& context)
{
	TestLog&						log		= context.getTestContext().getLog();
	tcu::ResultCollector			results	(log);
	const vector<VkPhysicalDevice>	devices	= enumeratePhysicalDevices(context.getInstanceInterface(), context.getInstance());

	log << TestLog::Integer("NumDevices", "Number of devices", "", QP_KEY_TAG_NONE, deInt64(devices.size()));

	for (size_t ndx = 0; ndx < devices.size(); ndx++)
		log << TestLog::Message << ndx << ": " << devices[ndx] << TestLog::EndMessage;

	CheckEnumeratePhysicalDevicesIncompleteResult()(context, results, devices.size());

	return tcu::TestStatus(results.getResult(), results.getMessage());
}